

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-connect6-error.c
# Opt level: O2

int run_test_tcp_connect6_error_fault(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  undefined8 uStack_1b0;
  char garbage [60];
  uv_tcp_t server;
  uv_connect_t req;
  
  builtin_strncpy(garbage + 0x30,"h blah blah",0xc);
  builtin_strncpy(garbage + 0x20,"ah blah blah bla",0x10);
  builtin_strncpy(garbage + 0x10,"lah blah blah bl",0x10);
  builtin_strncpy(garbage,"blah blah blah b",0x10);
  puVar2 = uv_default_loop();
  iVar1 = uv_tcp_init(puVar2,&server);
  if (iVar1 == 0) {
    iVar1 = uv_tcp_connect(&req,&server,(sockaddr *)garbage,connect_cb);
    if (iVar1 == -0x16) {
      uv_close((uv_handle_t *)&server,close_cb);
      puVar2 = uv_default_loop();
      uv_run(puVar2,UV_RUN_DEFAULT);
      if (connect_cb_called == 0) {
        if (close_cb_called == 1) {
          puVar2 = uv_default_loop();
          uv_walk(puVar2,close_walk_cb,(void *)0x0);
          uv_run(puVar2,UV_RUN_DEFAULT);
          puVar2 = uv_default_loop();
          iVar1 = uv_loop_close(puVar2);
          if (iVar1 == 0) {
            return 0;
          }
          pcVar3 = "0 == uv_loop_close(uv_default_loop())";
          uStack_1b0 = 0x45;
        }
        else {
          pcVar3 = "close_cb_called == 1";
          uStack_1b0 = 0x43;
        }
      }
      else {
        pcVar3 = "connect_cb_called == 0";
        uStack_1b0 = 0x42;
      }
    }
    else {
      pcVar3 = "r == UV_EINVAL";
      uStack_1b0 = 0x3c;
    }
  }
  else {
    pcVar3 = "r == 0";
    uStack_1b0 = 0x37;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-connect6-error.c"
          ,uStack_1b0,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(tcp_connect6_error_fault) {
  const char garbage[] =
      "blah blah blah blah blah blah blah blah blah blah blah blah";
  const struct sockaddr_in6* garbage_addr;
  uv_tcp_t server;
  int r;
  uv_connect_t req;

  garbage_addr = (const struct sockaddr_in6*) &garbage;

  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT(r == 0);
  r = uv_tcp_connect(&req,
                     &server,
                     (const struct sockaddr*) garbage_addr,
                     connect_cb);
  ASSERT(r == UV_EINVAL);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(connect_cb_called == 0);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}